

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_alloc.c
# Opt level: O2

void * lj_alloc_free(void *msp,void *ptr)

{
  long *plVar1;
  ulong uVar2;
  char *ptr_00;
  uint uVar3;
  ulong *puVar4;
  uint uVar5;
  int iVar6;
  void *in_RAX;
  undefined4 extraout_var;
  ulong *puVar7;
  msegmentptr pmVar8;
  size_t sVar9;
  void *pvVar10;
  char *pcVar11;
  long lVar12;
  ulong *puVar13;
  ulong *puVar14;
  long lVar15;
  ulong *addr;
  byte bVar16;
  ulong uVar17;
  ulong uVar18;
  ulong *puVar19;
  ulong *puVar20;
  ulong uVar21;
  
  if (ptr == (void *)0x0) {
    return in_RAX;
  }
  addr = (ulong *)((long)ptr + -0x10);
  uVar18 = *(ulong *)((long)ptr + -8) & 0xfffffffffffffffc;
  puVar7 = (ulong *)((long)ptr + uVar18);
  puVar13 = puVar7 + -2;
  uVar21 = uVar18;
  if ((*(ulong *)((long)ptr + -8) & 1) == 0) {
    uVar17 = *addr;
    if ((uVar17 & 1) != 0) {
      iVar6 = CALL_MUNMAP((void *)((long)addr - (uVar17 & 0xfffffffffffffffe)),
                          uVar18 + (uVar17 & 0xfffffffffffffffe) + 0x20);
      return (void *)CONCAT44(extraout_var,iVar6);
    }
    addr = (ulong *)((long)addr - uVar17);
    uVar21 = uVar17 + uVar18;
    if (addr == *(ulong **)((long)msp + 0x18)) {
      uVar17 = puVar7[-1];
      if ((~(uint)uVar17 & 3) == 0) {
        *(ulong *)((long)msp + 8) = uVar21;
        puVar7[-1] = uVar17 & 0xfffffffffffffffe;
        addr[1] = uVar21 | 1;
        *puVar13 = uVar21;
        return puVar13;
      }
    }
    else {
      puVar14 = (ulong *)addr[3];
      if (uVar17 < 0x100) {
        puVar19 = (ulong *)addr[2];
        if (puVar19 == puVar14) {
          bVar16 = (byte)(uVar17 >> 3) & 0x1f;
          *(uint *)msp = *msp & (-2 << bVar16 | 0xfffffffeU >> 0x20 - bVar16);
        }
        else {
          puVar19[3] = (ulong)puVar14;
          puVar14[2] = (ulong)puVar19;
        }
      }
      else {
        uVar17 = addr[6];
        if (puVar14 == addr) {
          if ((ulong *)addr[5] == (ulong *)0x0) {
            if ((ulong *)addr[4] == (ulong *)0x0) {
              puVar14 = (ulong *)0x0;
              goto LAB_00128037;
            }
            puVar19 = (ulong *)addr[4];
            puVar4 = addr + 4;
          }
          else {
            puVar19 = (ulong *)addr[5];
            puVar4 = addr + 5;
          }
          do {
            do {
              puVar20 = puVar4;
              puVar14 = puVar19;
              puVar19 = (ulong *)puVar14[5];
              puVar4 = puVar14 + 5;
            } while ((ulong *)puVar14[5] != (ulong *)0x0);
            puVar19 = (ulong *)puVar14[4];
            puVar4 = puVar14 + 4;
          } while ((ulong *)puVar14[4] != (ulong *)0x0);
          *puVar20 = 0;
        }
        else {
          uVar2 = addr[2];
          *(ulong **)(uVar2 + 0x18) = puVar14;
          puVar14[2] = uVar2;
        }
LAB_00128037:
        if (uVar17 != 0) {
          uVar2 = addr[7];
          if (addr == *(ulong **)((long)msp + uVar2 * 8 + 0x248)) {
            *(ulong **)((long)msp + uVar2 * 8 + 0x248) = puVar14;
            if (puVar14 != (ulong *)0x0) goto LAB_0012806c;
            bVar16 = (byte)uVar2 & 0x1f;
            *(uint *)((long)msp + 4) =
                 *(uint *)((long)msp + 4) & (-2 << bVar16 | 0xfffffffeU >> 0x20 - bVar16);
          }
          else {
            *(ulong **)(uVar17 + 0x20 + (ulong)(*(ulong **)(uVar17 + 0x20) != addr) * 8) = puVar14;
            if (puVar14 != (ulong *)0x0) {
LAB_0012806c:
              puVar14[6] = uVar17;
              uVar17 = addr[4];
              if (uVar17 != 0) {
                puVar14[4] = uVar17;
                *(ulong **)(uVar17 + 0x30) = puVar14;
              }
              uVar17 = addr[5];
              if (uVar17 != 0) {
                puVar14[5] = uVar17;
                *(ulong **)(uVar17 + 0x30) = puVar14;
              }
            }
          }
        }
      }
    }
  }
  uVar18 = *(ulong *)((long)ptr + (uVar18 - 8));
  if ((uVar18 & 2) != 0) {
    puVar7[-1] = uVar18 & 0xfffffffffffffffe;
    addr[1] = uVar21 | 1;
    *(ulong *)((long)addr + uVar21) = uVar21;
    goto LAB_00128108;
  }
  if (puVar13 == *(ulong **)((long)msp + 0x20)) {
    uVar21 = uVar21 + *(long *)((long)msp + 0x10);
    *(ulong *)((long)msp + 0x10) = uVar21;
    *(ulong **)((long)msp + 0x20) = addr;
    addr[1] = uVar21 | 1;
    if (addr == *(ulong **)((long)msp + 0x18)) {
      *(undefined8 *)((long)msp + 0x18) = 0;
      *(undefined8 *)((long)msp + 8) = 0;
    }
    if (uVar21 <= *(ulong *)((long)msp + 0x28)) {
      return (void *)(uVar21 | 1);
    }
    if (0x40 < uVar21) {
      uVar18 = (uVar21 + 0x1ffbf & 0xfffffffffffe0000) - 0x20000;
      pmVar8 = segment_holding((mstate)msp,(char *)addr);
      uVar21 = pmVar8->size;
      if (uVar18 <= uVar21) {
        pcVar11 = (char *)((long)msp + 0x348);
        ptr_00 = pmVar8->base;
        do {
          uVar17 = 0;
          if (ptr_00 <= pcVar11 && pcVar11 < ptr_00 + uVar21) goto LAB_001281c8;
          pcVar11 = *(char **)(pcVar11 + 0x10);
        } while (pcVar11 != (char *)0x0);
        pvVar10 = CALL_MREMAP_(ptr_00,uVar21,uVar21 - uVar18,(int)(ptr_00 + uVar21));
        if (pvVar10 == (void *)0xffffffffffffffff) {
          iVar6 = CALL_MUNMAP(pmVar8->base + (uVar21 - uVar18),uVar18);
          uVar17 = 0;
          if ((uVar18 == 0) || (uVar17 = 0, iVar6 != 0)) goto LAB_001281c8;
        }
        else if (uVar18 == 0) goto LAB_001281c5;
        pmVar8->size = pmVar8->size - uVar18;
        lVar15 = *(long *)((long)msp + 0x20);
        lVar12 = *(long *)((long)msp + 0x10) - uVar18;
        uVar21 = (ulong)(-(int)lVar15 - 0x10U & 7);
        uVar17 = lVar12 - uVar21;
        *(ulong *)((long)msp + 0x20) = lVar15 + uVar21;
        *(ulong *)((long)msp + 0x10) = uVar17;
        *(ulong *)(lVar15 + 8 + uVar21) = uVar17 | 1;
        *(undefined8 *)(lVar15 + 8 + lVar12) = 0x40;
        *(undefined8 *)((long)msp + 0x28) = 0x200000;
        uVar17 = uVar18;
        goto LAB_001281c8;
      }
    }
LAB_001281c5:
    uVar17 = 0;
LAB_001281c8:
    sVar9 = release_unused_segments((mstate)msp);
    if ((void *)(sVar9 + uVar17) != (void *)0x0) {
      return (void *)(sVar9 + uVar17);
    }
    pvVar10 = *(void **)((long)msp + 0x10);
    if (pvVar10 <= *(void **)((long)msp + 0x28)) {
      return pvVar10;
    }
    *(undefined8 *)((long)msp + 0x28) = 0xffffffffffffffff;
    return pvVar10;
  }
  if (puVar13 == *(ulong **)((long)msp + 0x18)) {
    uVar21 = uVar21 + *(long *)((long)msp + 8);
    *(ulong *)((long)msp + 8) = uVar21;
    *(ulong **)((long)msp + 0x18) = addr;
    addr[1] = uVar21 | 1;
    *(ulong *)((long)addr + uVar21) = uVar21;
    return (void *)(uVar21 | 1);
  }
  uVar21 = uVar21 + (uVar18 & 0xfffffffffffffffc);
  puVar14 = (ulong *)puVar7[1];
  if (uVar18 < 0x100) {
    puVar7 = (ulong *)*puVar7;
    if (puVar7 == puVar14) {
      bVar16 = (byte)(uVar18 >> 3) & 0x1f;
      *(uint *)msp = *msp & (-2 << bVar16 | 0xfffffffeU >> 0x20 - bVar16);
    }
    else {
      puVar7[3] = (ulong)puVar14;
      puVar14[2] = (ulong)puVar7;
    }
  }
  else {
    uVar18 = puVar7[4];
    if (puVar14 == puVar13) {
      if ((ulong *)puVar7[3] == (ulong *)0x0) {
        if ((ulong *)puVar7[2] == (ulong *)0x0) {
          puVar14 = (ulong *)0x0;
          goto LAB_001283e0;
        }
        puVar19 = (ulong *)puVar7[2];
        puVar4 = puVar7 + 2;
      }
      else {
        puVar19 = (ulong *)puVar7[3];
        puVar4 = puVar7 + 3;
      }
      do {
        do {
          puVar20 = puVar4;
          puVar14 = puVar19;
          puVar19 = (ulong *)puVar14[5];
          puVar4 = puVar14 + 5;
        } while ((ulong *)puVar14[5] != (ulong *)0x0);
        puVar19 = (ulong *)puVar14[4];
        puVar4 = puVar14 + 4;
      } while ((ulong *)puVar14[4] != (ulong *)0x0);
      *puVar20 = 0;
    }
    else {
      uVar17 = *puVar7;
      *(ulong **)(uVar17 + 0x18) = puVar14;
      puVar14[2] = uVar17;
    }
LAB_001283e0:
    if (uVar18 != 0) {
      uVar17 = puVar7[5];
      if (puVar13 == *(ulong **)((long)msp + uVar17 * 8 + 0x248)) {
        *(ulong **)((long)msp + uVar17 * 8 + 0x248) = puVar14;
        if (puVar14 != (ulong *)0x0) goto LAB_00128415;
        bVar16 = (byte)uVar17 & 0x1f;
        *(uint *)((long)msp + 4) =
             *(uint *)((long)msp + 4) & (-2 << bVar16 | 0xfffffffeU >> 0x20 - bVar16);
      }
      else {
        *(ulong **)(uVar18 + 0x20 + (ulong)(*(ulong **)(uVar18 + 0x20) != puVar13) * 8) = puVar14;
        if (puVar14 != (ulong *)0x0) {
LAB_00128415:
          puVar14[6] = uVar18;
          uVar18 = puVar7[2];
          if (uVar18 != 0) {
            puVar14[4] = uVar18;
            *(ulong **)(uVar18 + 0x30) = puVar14;
          }
          uVar18 = puVar7[3];
          if (uVar18 != 0) {
            puVar14[5] = uVar18;
            *(ulong **)(uVar18 + 0x30) = puVar14;
          }
        }
      }
    }
  }
  addr[1] = uVar21 | 1;
  *(ulong *)((long)addr + uVar21) = uVar21;
  if (addr == *(ulong **)((long)msp + 0x18)) {
    *(ulong *)((long)msp + 8) = uVar21;
    return (void *)(uVar21 | 1);
  }
LAB_00128108:
  if (uVar21 < 0x100) {
    uVar21 = uVar21 >> 3;
    puVar7 = (ulong *)((long)msp + uVar21 * 0x10 + 0x38);
    if ((*msp >> ((uint)uVar21 & 0x1f) & 1) == 0) {
      *(uint *)msp = *msp | 1 << ((byte)uVar21 & 0x1f);
      puVar13 = puVar7;
    }
    else {
      puVar13 = *(ulong **)((long)msp + uVar21 * 0x10 + 0x48);
    }
    *(ulong **)((long)msp + uVar21 * 0x10 + 0x48) = addr;
    puVar13[3] = (ulong)addr;
    addr[2] = (ulong)puVar13;
    addr[3] = (ulong)puVar7;
  }
  else {
    uVar5 = (uint)(uVar21 >> 8);
    if (uVar5 == 0) {
      uVar18 = 0;
    }
    else if (uVar5 < 0x10000) {
      uVar3 = 0x1f;
      if (uVar5 != 0) {
        for (; uVar5 >> uVar3 == 0; uVar3 = uVar3 - 1) {
        }
      }
      uVar18 = (ulong)((uVar21 >> ((ulong)(byte)(0x26 - (char)(uVar3 ^ 0x1f)) & 0x3f) & 1) != 0) |
               (ulong)((uVar3 ^ 0x1f) * 2 ^ 0x3e);
    }
    else {
      uVar18 = 0x1f;
    }
    puVar7 = (ulong *)((long)msp + uVar18 * 8 + 0x248);
    addr[7] = uVar18;
    addr[4] = 0;
    addr[5] = 0;
    if ((*(uint *)((long)msp + 4) >> ((uint)uVar18 & 0x1f) & 1) == 0) {
      *(uint *)((long)msp + 4) = *(uint *)((long)msp + 4) | 1 << ((byte)uVar18 & 0x1f);
      puVar13 = puVar7;
    }
    else {
      bVar16 = 0x39 - (char)(uVar18 >> 1);
      if (uVar18 == 0x1f) {
        bVar16 = 0;
      }
      lVar15 = uVar21 << (bVar16 & 0x3f);
      puVar7 = (ulong *)*puVar7;
      do {
        puVar14 = puVar7;
        if ((puVar14[1] & 0xfffffffffffffffc) == uVar21) {
          puVar7 = puVar14 + 2;
          puVar13 = (ulong *)puVar14[2];
          puVar13[3] = (ulong)addr;
          lVar15 = 0x30;
          lVar12 = 0x10;
          puVar19 = (ulong *)0x0;
          goto LAB_00128312;
        }
        lVar12 = lVar15 >> 0x3f;
        lVar15 = lVar15 * 2;
        puVar7 = (ulong *)puVar14[4 - lVar12];
      } while ((ulong *)puVar14[4 - lVar12] != (ulong *)0x0);
      puVar7 = puVar14 + (4 - lVar12);
      puVar13 = puVar14;
    }
    lVar12 = 0x30;
    lVar15 = 0x10;
    puVar14 = addr;
    puVar19 = addr;
LAB_00128312:
    *puVar7 = (ulong)addr;
    *(ulong **)((long)addr + lVar12) = puVar13;
    addr[3] = (ulong)puVar14;
    *(ulong **)((long)addr + lVar15) = puVar19;
    plVar1 = (long *)((long)msp + 0x30);
    *plVar1 = *plVar1 + -1;
    if (*plVar1 == 0) {
      pvVar10 = (void *)release_unused_segments((mstate)msp);
      return pvVar10;
    }
  }
  return puVar7;
}

Assistant:

static LJ_NOINLINE void *lj_alloc_free(void *msp, void *ptr)
{
  if (ptr != 0) {
    mchunkptr p = mem2chunk(ptr);
    mstate fm = (mstate)msp;
    size_t psize = chunksize(p);
    mchunkptr next = chunk_plus_offset(p, psize);
    if (!pinuse(p)) {
      size_t prevsize = p->prev_foot;
      if ((prevsize & IS_DIRECT_BIT) != 0) {
	prevsize &= ~IS_DIRECT_BIT;
	psize += prevsize + DIRECT_FOOT_PAD;
	CALL_MUNMAP((char *)p - prevsize, psize);
	return NULL;
      } else {
	mchunkptr prev = chunk_minus_offset(p, prevsize);
	psize += prevsize;
	p = prev;
	/* consolidate backward */
	if (p != fm->dv) {
	  unlink_chunk(fm, p, prevsize);
	} else if ((next->head & INUSE_BITS) == INUSE_BITS) {
	  fm->dvsize = psize;
	  set_free_with_pinuse(p, psize, next);
	  return NULL;
	}
      }
    }
    if (!cinuse(next)) {  /* consolidate forward */
      if (next == fm->top) {
	size_t tsize = fm->topsize += psize;
	fm->top = p;
	p->head = tsize | PINUSE_BIT;
	if (p == fm->dv) {
	  fm->dv = 0;
	  fm->dvsize = 0;
	}
	if (tsize > fm->trim_check)
	  alloc_trim(fm, 0);
	return NULL;
      } else if (next == fm->dv) {
	size_t dsize = fm->dvsize += psize;
	fm->dv = p;
	set_size_and_pinuse_of_free_chunk(p, dsize);
	return NULL;
      } else {
	size_t nsize = chunksize(next);
	psize += nsize;
	unlink_chunk(fm, next, nsize);
	set_size_and_pinuse_of_free_chunk(p, psize);
	if (p == fm->dv) {
	  fm->dvsize = psize;
	  return NULL;
	}
      }
    } else {
      set_free_with_pinuse(p, psize, next);
    }

    if (is_small(psize)) {
      insert_small_chunk(fm, p, psize);
    } else {
      tchunkptr tp = (tchunkptr)p;
      insert_large_chunk(fm, tp, psize);
      if (--fm->release_checks == 0)
	release_unused_segments(fm);
    }
  }
  return NULL;
}